

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

bool CSOAA::ec_is_label_definition(example *ec)

{
  size_t sVar1;
  uchar *puVar2;
  wclass *pwVar3;
  v_array<unsigned_char> *in_RDI;
  size_t j;
  v_array<COST_SENSITIVE::wclass> costs;
  ulong local_38;
  v_array<COST_SENSITIVE::wclass> local_30;
  v_array<unsigned_char> *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  sVar1 = v_array<unsigned_char>::size(in_RDI);
  if (sVar1 == 0) {
    local_1 = false;
  }
  else {
    puVar2 = v_array<unsigned_char>::operator[](local_10,0);
    if (*puVar2 == 'l') {
      local_30._begin = (wclass *)local_10[0x341]._end;
      local_30._end = (wclass *)local_10[0x341].end_array;
      local_30.end_array = (wclass *)local_10[0x341].erase_count;
      local_30.erase_count = (size_t)local_10[0x342]._begin;
      for (local_38 = 0; sVar1 = v_array<COST_SENSITIVE::wclass>::size(&local_30), local_38 < sVar1;
          local_38 = local_38 + 1) {
        pwVar3 = v_array<COST_SENSITIVE::wclass>::operator[](&local_30,local_38);
        if ((pwVar3->class_index != 0) ||
           (pwVar3 = v_array<COST_SENSITIVE::wclass>::operator[](&local_30,local_38),
           pwVar3->x <= 0.0)) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ec_is_label_definition(example& ec)  // label defs look like "0:___" or just "label:___"
{
  if (ec.indices.size() < 1)
    return false;
  if (ec.indices[0] != 'l')
    return false;
  v_array<COST_SENSITIVE::wclass> costs = ec.l.cs.costs;
  for (size_t j = 0; j < costs.size(); j++)
    if ((costs[j].class_index != 0) || (costs[j].x <= 0.))
      return false;
  return true;
}